

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O1

void __thiscall
Assimp::ObjFileParser::parseFile(ObjFileParser *this,IOStreamBuffer<char> *streamBuffer)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> it;
  byte *pbVar5;
  Model *pMVar6;
  byte *pbVar7;
  bool bVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  long lVar12;
  byte *pbVar13;
  ulong uVar14;
  aiPrimitiveType type;
  string name;
  vector<char,_std::allocator<char>_> buffer;
  string local_90;
  uint local_6c;
  vector<char,_std::allocator<char>_> local_68;
  long *local_50 [2];
  long local_40 [2];
  
  local_6c = (uint)streamBuffer->m_filesize;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (char *)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
       = (char *)0x0;
  local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar14 = 0;
LAB_004ab501:
  bVar8 = IOStreamBuffer<char>::getNextDataLine(streamBuffer,&local_68,'\\');
  if (!bVar8) {
    if (local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (char *)0x0) {
      operator_delete(local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  (this->m_DataIt)._M_current =
       local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (this->m_DataItEnd)._M_current =
       local_68.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  uVar4 = streamBuffer->m_filePos;
  if (uVar14 < uVar4) {
    (*this->m_progress->_vptr_ProgressHandler[3])
              (this->m_progress,uVar4 & 0xffffffff,(ulong)local_6c);
    uVar14 = uVar4;
  }
  it._M_current = (this->m_DataIt)._M_current;
  cVar1 = *it._M_current;
  switch(cVar1) {
  case 'f':
    type = aiPrimitiveType_POLYGON;
    break;
  case 'g':
    getGroupName(this);
    goto LAB_004ab501;
  case 'h':
  case 'i':
  case 'j':
  case 'k':
  case 'n':
  case 'q':
  case 'r':
  case 't':
    goto switchD_004ab563_caseD_68;
  case 'l':
  case 'p':
    type = (cVar1 == 'l') + aiPrimitiveType_POINT;
    break;
  case 'm':
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              (it,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                  (this->m_DataItEnd)._M_current,&local_90);
    lVar12 = std::__cxx11::string::find((char *)&local_90,0x6e9c00,0);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    iVar9 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar9 == 0) {
      getGroupNumberAndResolution(this);
      bVar8 = true;
    }
    else {
      iVar9 = std::__cxx11::string::compare((char *)&local_90);
      if (iVar9 == 0) {
        bVar8 = true;
        getMaterialLib(this);
      }
      else {
        bVar8 = false;
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    if (!bVar8) {
switchD_004ab563_caseD_68:
      pbVar13 = (byte *)(this->m_DataIt)._M_current;
      pbVar5 = (byte *)(this->m_DataItEnd)._M_current;
      if (pbVar5 + -1 != pbVar13 && pbVar13 != pbVar5) {
        do {
          if (((*pbVar13 < 0xe) && ((0x3401U >> (*pbVar13 & 0x1f) & 1) != 0)) ||
             (pbVar13 = pbVar13 + 1, pbVar13 == pbVar5)) break;
        } while (pbVar13 != pbVar5 + -1);
      }
      pbVar7 = pbVar13;
      if (pbVar13 != pbVar5) {
        pbVar13 = pbVar13 + 1;
        this->m_uiLine = this->m_uiLine + 1;
        pbVar7 = pbVar13;
      }
      for (; (pbVar7 != pbVar5 && ((*pbVar7 == 0x20 || (pbVar13 = pbVar7, *pbVar7 == 9))));
          pbVar7 = pbVar7 + 1) {
        pbVar13 = pbVar5;
      }
      (this->m_DataIt)._M_current = (char *)pbVar13;
    }
    goto LAB_004ab501;
  case 'o':
    getObjectName(this);
    goto LAB_004ab501;
  case 's':
    getGroupNumber(this);
    goto LAB_004ab501;
  case 'u':
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    local_90._M_string_length = 0;
    local_90.field_2._M_local_buf[0] = '\0';
    getNameNoSpace<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
              (it,(__normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>)
                  (this->m_DataItEnd)._M_current,&local_90);
    lVar12 = std::__cxx11::string::find((char *)&local_90,0x6e9c00,0);
    if (lVar12 != -1) {
      std::__cxx11::string::substr((ulong)local_50,(ulong)&local_90);
      std::__cxx11::string::operator=((string *)&local_90,(string *)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
    }
    iVar9 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar9 == 0) {
      getMaterialDesc(this);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,
                      CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,
                               local_90.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_004ab501;
  case 'v':
    (this->m_DataIt)._M_current = it._M_current + 1;
    bVar2 = it._M_current[1];
    if (bVar2 < 0x6e) {
      if ((bVar2 == 9) || (bVar2 == 0x20)) {
        sVar11 = getNumComponentsInDataDefinition(this);
        if (sVar11 == 6) {
          pMVar6 = (this->m_pModel)._M_t.
                   super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                   .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
          getTwoVectors3(this,&pMVar6->m_Vertices,&pMVar6->m_VertexColors);
        }
        else if (sVar11 == 4) {
          getHomogeneousVector3
                    (this,&((this->m_pModel)._M_t.
                            super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                            .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                           m_Vertices);
        }
        else if (sVar11 == 3) {
          getVector3(this,&((this->m_pModel)._M_t.
                            super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                            .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                           m_Vertices);
        }
      }
    }
    else if (bVar2 == 0x6e) {
      (this->m_DataIt)._M_current = it._M_current + 2;
      getVector3(this,&((this->m_pModel)._M_t.
                        super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                        .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl)->
                       m_Normals);
    }
    else if (bVar2 == 0x74) {
      (this->m_DataIt)._M_current = it._M_current + 2;
      sVar11 = getTexCoordVector(this,&((this->m_pModel)._M_t.
                                        super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
                                        .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>.
                                       _M_head_impl)->m_TextureCoord);
      pMVar6 = (this->m_pModel)._M_t.
               super___uniq_ptr_impl<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ._M_t.
               super__Tuple_impl<0UL,_Assimp::ObjFile::Model_*,_std::default_delete<Assimp::ObjFile::Model>_>
               .super__Head_base<0UL,_Assimp::ObjFile::Model_*,_false>._M_head_impl;
      uVar3 = pMVar6->m_TextureCoordDim;
      uVar10 = (uint)sVar11;
      if ((uint)sVar11 < uVar3) {
        uVar10 = uVar3;
      }
      pMVar6->m_TextureCoordDim = uVar10;
    }
    goto LAB_004ab501;
  default:
    if (cVar1 != '#') goto switchD_004ab563_caseD_68;
    getComment(this);
    goto LAB_004ab501;
  }
  getFace(this,type);
  goto LAB_004ab501;
}

Assistant:

void ObjFileParser::parseFile( IOStreamBuffer<char> &streamBuffer ) {
    // only update every 100KB or it'll be too slow
    //const unsigned int updateProgressEveryBytes = 100 * 1024;
    unsigned int progressCounter = 0;
    const unsigned int bytesToProcess = static_cast<unsigned int>(streamBuffer.size());
    const unsigned int progressTotal = bytesToProcess;
    unsigned int processed = 0;
    size_t lastFilePos( 0 );

    std::vector<char> buffer;
    while ( streamBuffer.getNextDataLine( buffer, '\\' ) ) {
        m_DataIt = buffer.begin();
        m_DataItEnd = buffer.end();

        // Handle progress reporting
        const size_t filePos( streamBuffer.getFilePos() );
        if ( lastFilePos < filePos ) {
            processed = static_cast<unsigned int>(filePos);
            lastFilePos = filePos;
            progressCounter++;
            m_progress->UpdateFileRead( processed, progressTotal );
        }

        // parse line
        switch (*m_DataIt) {
        case 'v': // Parse a vertex texture coordinate
            {
                ++m_DataIt;
                if (*m_DataIt == ' ' || *m_DataIt == '\t') {
                    size_t numComponents = getNumComponentsInDataDefinition();
                    if (numComponents == 3) {
                        // read in vertex definition
                        getVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 4) {
                        // read in vertex definition (homogeneous coords)
                        getHomogeneousVector3(m_pModel->m_Vertices);
                    } else if (numComponents == 6) {
                        // read vertex and vertex-color
                        getTwoVectors3(m_pModel->m_Vertices, m_pModel->m_VertexColors);
                    }
                } else if (*m_DataIt == 't') {
                    // read in texture coordinate ( 2D or 3D )
                    ++m_DataIt;
                    size_t dim = getTexCoordVector(m_pModel->m_TextureCoord);
                    m_pModel->m_TextureCoordDim = std::max(m_pModel->m_TextureCoordDim, (unsigned int)dim);
                } else if (*m_DataIt == 'n') {
                    // Read in normal vector definition
                    ++m_DataIt;
                    getVector3( m_pModel->m_Normals );
                }
            }
            break;

        case 'p': // Parse a face, line or point statement
        case 'l':
        case 'f':
            {
                getFace(*m_DataIt == 'f' ? aiPrimitiveType_POLYGON : (*m_DataIt == 'l'
                    ? aiPrimitiveType_LINE : aiPrimitiveType_POINT));
            }
            break;

        case '#': // Parse a comment
            {
                getComment();
            }
            break;

        case 'u': // Parse a material desc. setter
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if(name == "usemtl")
                {
                    getMaterialDesc();
                }
            }
            break;

        case 'm': // Parse a material library or merging group ('mg')
            {
                std::string name;

                getNameNoSpace(m_DataIt, m_DataItEnd, name);

                size_t nextSpace = name.find(" ");
                if (nextSpace != std::string::npos)
                    name = name.substr(0, nextSpace);

                if (name == "mg")
                    getGroupNumberAndResolution();
                else if(name == "mtllib")
                    getMaterialLib();
				else
					goto pf_skip_line;
            }
            break;

        case 'g': // Parse group name
            {
                getGroupName();
            }
            break;

        case 's': // Parse group number
            {
                getGroupNumber();
            }
            break;

        case 'o': // Parse object name
            {
                getObjectName();
            }
            break;

        default:
            {
pf_skip_line:
                m_DataIt = skipLine<DataArrayIt>( m_DataIt, m_DataItEnd, m_uiLine );
            }
            break;
        }
    }
}